

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

void __thiscall indk::Position::doAdd(Position *this,Position *P)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  Error *pEVar5;
  ulong uVar6;
  float fVar7;
  initializer_list<float> __l;
  allocator_type local_41;
  vector<float,_std::allocator<float>_> local_40;
  float local_28;
  float local_24;
  
  uVar1 = this->DimensionsCount;
  uVar2 = P->DimensionsCount;
  if (uVar1 == uVar2) {
    uVar3 = this->Xm;
    if (uVar3 == P->Xm) {
      if ((ulong)uVar1 != 0) {
        pfVar4 = this->X;
        uVar6 = 0;
        do {
          fVar7 = -1.0;
          if (uVar6 < uVar2) {
            fVar7 = P->X[uVar6];
          }
          fVar7 = fVar7 + pfVar4[uVar6];
          pfVar4[uVar6] = fVar7;
          if ((float)uVar3 < fVar7) {
            pEVar5 = (Error *)__cxa_allocate_exception(0x28);
            local_28 = this->X[uVar6];
            local_24 = (float)this->Xm;
            __l._M_len = 2;
            __l._M_array = &local_28;
            std::vector<float,_std::allocator<float>_>::vector(&local_40,__l,&local_41);
            Error::Error(pEVar5,8,&local_40);
            __cxa_throw(pEVar5,&Error::typeinfo,Error::~Error);
          }
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      return;
    }
    pEVar5 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(pEVar5,9);
  }
  else {
    pEVar5 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(pEVar5,10);
  }
  __cxa_throw(pEVar5,&Error::typeinfo,Error::~Error);
}

Assistant:

void indk::Position::doAdd(const indk::Position *P) {
    if (DimensionsCount != P->getDimensionsCount()) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
    }
    if (Xm != P->getXm()) {
        throw indk::Error(indk::Error::EX_POSITION_RANGES);
    }
    for (unsigned int i = 0; i < DimensionsCount; i++) {
        X[i] += P->getPositionValue(i);
        if (X[i] > Xm) {
            throw indk::Error(indk::Error::EX_POSITION_OUT_RANGES, {X[i], (float)Xm});
        }
    }
}